

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-feat.c
# Opt level: O0

void project_feature_handler_LIGHT_WEAK(project_feature_handler_context_t *context)

{
  loc_conflict grid_00;
  _Bool _Var1;
  square_conflict *psVar2;
  loc_conflict grid;
  project_feature_handler_context_t *context_local;
  
  grid_00 = context->grid;
  psVar2 = square((chunk *)cave,grid_00);
  flag_on_dbg(psVar2->info,3,2,"square(cave, grid)->info","SQUARE_GLOW");
  _Var1 = square_isview((chunk *)cave,grid_00);
  if (_Var1) {
    if (player->timed[2] == 0) {
      context->obvious = true;
    }
    player->upkeep->update = player->upkeep->update | 0xc0;
  }
  return;
}

Assistant:

static void project_feature_handler_LIGHT_WEAK(project_feature_handler_context_t *context)
{
	const struct loc grid = context->grid;

	/* Turn on the light */
	sqinfo_on(square(cave, grid)->info, SQUARE_GLOW);

	/* Grid is in line of sight */
	if (square_isview(cave, grid)) {
		if (!player->timed[TMD_BLIND]) {
			/* Observe */
			context->obvious = true;
		}

		/* Fully update the visuals */
		player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);
	}
}